

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * cmQtAutoGen::QuotedCommand
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *command)

{
  pointer pbVar1;
  char *in_RCX;
  pointer pbVar2;
  string_view text;
  string cesc;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    text._M_str = in_RCX;
    text._M_len = (size_t)(pbVar2->_M_dataplus)._M_p;
    Quoted_abi_cxx11_(&cesc,(cmQtAutoGen *)pbVar2->_M_string_length,text);
    if ((pbVar2->_M_string_length != 0) && (cesc._M_string_length <= pbVar2->_M_string_length + 2))
    {
      std::__cxx11::string::find((char)&cesc,0x20);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&cesc);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::QuotedCommand(std::vector<std::string> const& command)
{
  std::string res;
  for (std::string const& item : command) {
    if (!res.empty()) {
      res.push_back(' ');
    }
    std::string const cesc = cmQtAutoGen::Quoted(item);
    if (item.empty() || (cesc.size() > (item.size() + 2)) ||
        (cesc.find(' ') != std::string::npos)) {
      res += cesc;
    } else {
      res += item;
    }
  }
  return res;
}